

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FirewallOperator::process
          (FirewallOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  uint16_t *puVar1;
  bool bVar2;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0)
  goto switchD_001b563c_default;
  bVar2 = std::function<bool_(const_helics::Message_*)>::operator()
                    ((function<bool_(const_helics::Message_*)> *)(message + 1),
                     (in_RDX->_M_t).
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
  switch(*(undefined4 *)
          &message[5]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl) {
  case 0:
    if (!bVar2) break;
    goto LAB_001b5675;
  case 1:
    if (bVar2) break;
LAB_001b5675:
    std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
              (in_RDX,(pointer)0x0);
    break;
  case 2:
    if (bVar2) {
      puVar1 = &((in_RDX->_M_t).
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->flags;
      *puVar1 = *puVar1 | 0x400;
    }
    break;
  case 3:
    if (bVar2) {
      puVar1 = &((in_RDX->_M_t).
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->flags;
      *puVar1 = *puVar1 | 0x2000;
    }
    break;
  case 4:
    if (bVar2) {
      puVar1 = &((in_RDX->_M_t).
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->flags;
      *puVar1 = *puVar1 | 0x4000;
    }
  }
switchD_001b563c_default:
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)
       (in_RDX->_M_t).
       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  (in_RDX->_M_t).super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> FirewallOperator::process(std::unique_ptr<Message> message)
{
    if (checkFunction) {
        bool res = checkFunction(message.get());
        switch (operation) {
            case operations::drop:
                if (res) {
                    message = nullptr;
                }
                break;
            case operations::pass:
                if (!res) {
                    message = nullptr;
                }
                break;
            case operations::set_flag1:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag1);
                }
                break;
            case operations::set_flag2:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag2);
                }
                break;
            case operations::set_flag3:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag3);
                }
                break;
            case operations::none:
                break;
        }
    }
    return message;
}